

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contract.cpp
# Opt level: O1

void __thiscall
Contract::Contract(Contract *this,string *id,int *minAssignments,int *maxAssignments,
                  int *minWorkingDays,int *maxWorkingDays,int *minDaysOff,int *maxDaysOff,
                  int *WorkingWeekends,int *completeWeekends)

{
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->minimumNumberOfAssignments = *minAssignments;
  this->maximumNumberOfAssignments = *maxAssignments;
  this->minimumNumberOfConsecutiveWorkingDays = *minWorkingDays;
  this->maximumNumberOfConsecutiveWorkingDays = *maxWorkingDays;
  this->minimumNumberOfConsecutiveDaysOff = *minDaysOff;
  this->maximumNumberOfConsecutiveDaysOff = *maxDaysOff;
  this->maximumNumberOfWorkingWeekends = *WorkingWeekends;
  this->completeWeekends = *completeWeekends == 1;
  return;
}

Assistant:

Contract::Contract(const string &id, const int &minAssignments, const int &maxAssignments, const int &minWorkingDays,
                   const int &maxWorkingDays, const int &minDaysOff, const int &maxDaysOff, const int &WorkingWeekends,
                   const int &completeWeekends) {
    this->id = id;
    minimumNumberOfAssignments = minAssignments;
    maximumNumberOfAssignments = maxAssignments;
    minimumNumberOfConsecutiveWorkingDays = minWorkingDays;
    maximumNumberOfConsecutiveWorkingDays = maxWorkingDays;
    minimumNumberOfConsecutiveDaysOff = minDaysOff;
    maximumNumberOfConsecutiveDaysOff = maxDaysOff;
    maximumNumberOfWorkingWeekends = WorkingWeekends;
    this->completeWeekends = completeWeekends == 1 ? true : false;
}